

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void * btreeblk_alloc_sub(void *voidhandle,bid_t *bid)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  bid_t *bid_00;
  size_t idx;
  ulong uVar5;
  
  if (*(int *)((long)voidhandle + 0x58) == 0) {
    pvVar4 = btreeblk_alloc(voidhandle,bid);
    return pvVar4;
  }
  bid_00 = *(bid_t **)((long)voidhandle + 0x60);
  if (*bid_00 != 0xffffffffffffffff) {
    iVar2 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),*bid_00);
    if (iVar2 == 0) {
      for (uVar3 = 0; bid_00 = *(bid_t **)((long)voidhandle + 0x60),
          uVar3 < *(ushort *)((long)bid_00 + 0xc); uVar3 = uVar3 + 1) {
        if (*(char *)(bid_00[2] + uVar3) == '\0') {
          _btreeblk_add_stale_block
                    ((btreeblk_handle *)voidhandle,
                     (uint)bid_00[1] * uVar3 + (ulong)*voidhandle * *bid_00,(uint)bid_00[1]);
        }
      }
    }
    else {
      bid_00 = *(bid_t **)((long)voidhandle + 0x60);
      uVar3 = 0;
      for (uVar5 = 0; *(ushort *)((long)bid_00 + 0xc) != uVar5; uVar5 = uVar5 + 1) {
        if (*(char *)(bid_00[2] + uVar5) == '\0') {
          *(undefined1 *)(bid_00[2] + uVar5) = 1;
          puVar1 = *(ulong **)((long)voidhandle + 0x60);
          *bid = uVar3 | *puVar1 | 0x20000000000000;
          pvVar4 = _btreeblk_read(voidhandle,*puVar1,0);
          btreeblk_set_dirty(voidhandle,**(bid_t **)((long)voidhandle + 0x60));
          return (void *)((ulong)(uint)((int)uVar5 *
                                       *(int *)(*(long *)((long)voidhandle + 0x60) + 8)) +
                         (long)pvVar4);
        }
        uVar3 = uVar3 + 0x1000000000000;
      }
    }
  }
  pvVar4 = _btreeblk_alloc(voidhandle,bid_00,0);
  memset(*(void **)(*(long *)((long)voidhandle + 0x60) + 0x10),0,
         (ulong)*(ushort *)(*(long *)((long)voidhandle + 0x60) + 0xc));
  **(undefined1 **)(*(long *)((long)voidhandle + 0x60) + 0x10) = 1;
  *bid = **(ulong **)((long)voidhandle + 0x60) | 0x20000000000000;
  return pvVar4;
}

Assistant:

void * btreeblk_alloc_sub(void *voidhandle, bid_t *bid)
{
    int i;
    void *addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (handle->nsb == 0) {
        return btreeblk_alloc(voidhandle, bid);
    }

    // check current block is available
    if (handle->sb[0].bid != BLK_NOT_FOUND) {
        if (filemgr_is_writable(handle->file, handle->sb[0].bid)) {
            // check if there is an empty slot
            for (i=0;i<handle->sb[0].nblocks;++i){
                if (handle->sb[0].bitmap[i] == 0) {
                    // return subblock
                    handle->sb[0].bitmap[i] = 1;
                    bid2subbid(handle->sb[0].bid, 0, i, bid);
                    addr = _btreeblk_read(voidhandle, handle->sb[0].bid, 0);
                    btreeblk_set_dirty(voidhandle, handle->sb[0].bid);
                    return (void*)
                           ((uint8_t*)addr +
                            handle->sb[0].sb_size * i);
                }
            }
        } else {
            // we have to mark all unused slots as stale
            size_t idx;
            for (idx=0; idx<handle->sb[0].nblocks; ++idx) {
                if (handle->sb[0].bitmap[idx] == 0) {
                    _btreeblk_add_stale_block(handle,
                        (handle->sb[0].bid * handle->nodesize)
                            + (idx * handle->sb[0].sb_size),
                        handle->sb[0].sb_size);
                }
            }
        }
    }

    // existing subblock cannot be used .. give it up & allocate new one
    addr = _btreeblk_alloc(voidhandle, &handle->sb[0].bid, 0);
    memset(handle->sb[0].bitmap, 0, handle->sb[0].nblocks);
    i = 0;
    handle->sb[0].bitmap[i] = 1;
    bid2subbid(handle->sb[0].bid, 0, i, bid);
    return (void*)((uint8_t*)addr + handle->sb[0].sb_size * i);
}